

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

optional<long>
wallet::GetSignedTxinWeight
          (CWallet *wallet,CCoinControl *coin_control,CTxIn *txin,CTxOut *txo,bool tx_is_segwit,
          bool can_grind_r)

{
  bool bVar1;
  CWallet *in_RCX;
  Descriptor *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  long in_RSI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  optional<long> oVar3;
  unique_ptr<Descriptor,_std::default_delete<Descriptor>_> desc;
  optional<long> weight;
  optional<CTxIn> *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  optional<CTxIn> *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  CCoinControl *in_stack_fffffffffffffea8;
  CScript *script_pubkey;
  undefined2 uVar4;
  undefined4 in_stack_fffffffffffffed0;
  bool local_109;
  _Storage<long,_true> local_a8;
  undefined1 local_a0;
  CScript local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::optional<long>::optional((optional<long> *)in_stack_fffffffffffffe88);
  local_109 = false;
  if (in_RSI != 0) {
    CCoinControl::GetInputWeight
              (in_stack_fffffffffffffea8,
               (COutPoint *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    local_109 = std::optional::operator_cast_to_bool((optional<long> *)in_stack_fffffffffffffe88);
  }
  if (local_109 == false) {
    script_pubkey = &local_28;
    CScript::CScript((CScript *)in_stack_fffffffffffffe88,(CScript *)0x452b68);
    GetDescriptor(in_RCX,(CCoinControl *)CONCAT44(in_R8D,in_stack_fffffffffffffed0),script_pubkey);
    uVar4 = (undefined2)((ulong)script_pubkey >> 0x30);
    CScript::~CScript((CScript *)in_stack_fffffffffffffe88);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                       in_stack_fffffffffffffe88);
    if (bVar1) {
      std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator*
                ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                 in_stack_fffffffffffffe98);
      std::optional<CTxIn>::optional<const_CTxIn_&,_true>
                (in_stack_fffffffffffffe98,
                 (CTxIn *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
      oVar3 = MaxInputWeight(in_RDX,(optional<CTxIn> *)in_RCX,
                             (CCoinControl *)CONCAT44(in_R8D,in_stack_fffffffffffffed0),
                             SUB21((ushort)uVar4 >> 8,0),SUB21(uVar4,0));
      local_a8._M_value =
           oVar3.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
      local_a0 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
                 super__Optional_payload_base<long>._M_engaged;
      std::optional<CTxIn>::~optional(in_stack_fffffffffffffe88);
    }
    else {
      std::optional<long>::optional((optional<long> *)in_stack_fffffffffffffe88);
    }
    std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::~unique_ptr
              ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)in_stack_fffffffffffffe98
              );
    uVar2 = extraout_RDX_00;
  }
  else {
    std::optional<long>::value((optional<long> *)in_stack_fffffffffffffe98);
    std::optional<long>::optional<long_&,_true>
              ((optional<long> *)in_stack_fffffffffffffe98,
               (long *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    uVar2 = extraout_RDX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_
         = (undefined7)((ulong)uVar2 >> 8);
    oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_engaged = (bool)local_a0;
    oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = local_a8._M_value;
    return (optional<long>)
           oVar3.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

static std::optional<int64_t> GetSignedTxinWeight(const CWallet* wallet, const CCoinControl* coin_control,
                                                  const CTxIn& txin, const CTxOut& txo, const bool tx_is_segwit,
                                                  const bool can_grind_r)
{
    // If weight was provided, use that.
    std::optional<int64_t> weight;
    if (coin_control && (weight = coin_control->GetInputWeight(txin.prevout))) {
        return weight.value();
    }

    // Otherwise, use the maximum satisfaction size provided by the descriptor.
    std::unique_ptr<Descriptor> desc{GetDescriptor(wallet, coin_control, txo.scriptPubKey)};
    if (desc) return MaxInputWeight(*desc, {txin}, coin_control, tx_is_segwit, can_grind_r);

    return {};
}